

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::EnumValBuilder::~EnumValBuilder(EnumValBuilder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumVal *pEVar2;
  pointer pcVar3;
  
  pEVar2 = this->temp;
  if (pEVar2 != (EnumVal *)0x0) {
    SymbolTable<flatbuffers::Value>::~SymbolTable(&pEVar2->attributes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pEVar2->doc_comment);
    pcVar3 = (pEVar2->name)._M_dataplus._M_p;
    paVar1 = &(pEVar2->name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pEVar2,0xa8);
    return;
  }
  return;
}

Assistant:

~EnumValBuilder() { delete temp; }